

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_input_array_stride_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool row_major;
  uint32_t uVar1;
  SPIRType SStack_178;
  
  get_presumed_input_type(&SStack_178,this,type,index);
  row_major = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationRowMajor);
  uVar1 = get_declared_type_array_stride_msl(this,&SStack_178,false,row_major);
  SPIRType::~SPIRType(&SStack_178);
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_declared_input_array_stride_msl(const SPIRType &type, uint32_t index) const
{
	return get_declared_type_array_stride_msl(get_presumed_input_type(type, index), false,
	                                          has_member_decoration(type.self, index, DecorationRowMajor));
}